

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::IsLinearMapping
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,int side)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_10> TStack_68;
  
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&TStack_68);
  pztopology::TPZPyramid::LowerDimensionSides(side,(TPZStack<int,_10> *)&TStack_68);
  if (0x12 < (uint)side) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x28);
  }
  if ((side < 5) || (this->fNeighbours[side - 5].fGeoElIndex == -1)) {
    bVar1 = TStack_68.super_TPZVec<int>.fNElements < 1;
    if (0 < TStack_68.super_TPZVec<int>.fNElements) {
      lVar2 = 1;
      do {
        if ((4 < (long)TStack_68.super_TPZVec<int>.fStore[lVar2 + -1]) &&
           ((this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes
            [(long)TStack_68.super_TPZVec<int>.fStore[lVar2 + -1] * 3 + -8] != -1)) break;
        bVar1 = TStack_68.super_TPZVec<int>.fNElements <= lVar2;
        bVar3 = lVar2 != TStack_68.super_TPZVec<int>.fNElements;
        lVar2 = lVar2 + 1;
      } while (bVar3);
    }
  }
  else {
    bVar1 = false;
  }
  TPZManVector<int,_10>::~TPZManVector(&TStack_68);
  return bVar1;
}

Assistant:

bool pzgeom::TPZGeoBlend<TGeo>::IsLinearMapping(int side) const
{
    TPZStack<int> LowAllSides;
    TGeo::LowerDimensionSides(side,LowAllSides);
    if(side < 0 || side > TGeo::NSides-1)
    {
        DebugStop();
        return 0;
    }
    bool straight = true;
    
    if(side >= TGeo::NNodes && fNeighbours[side-TGeo::NNodes].ElementIndex() != -1)
    {
        straight = false;
        return straight;
    }
    for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
    {
        if(LowAllSides[lowside] >= TGeo::NNodes && fNeighbours[LowAllSides[lowside]-TGeo::NNodes].ElementIndex() != -1)
        {
            straight = false;
            return straight;
        }
    }
    return straight;
}